

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONState.h
# Opt level: O0

string * __thiscall
cmJSONState::Error::GetErrorMessage_abi_cxx11_(string *__return_storage_ptr__,Error *this)

{
  string local_40;
  undefined1 local_19;
  Error *local_18;
  Error *this_local;
  string *output;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Error *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->message);
  if (0 < (this->location).line) {
    cmStrCat<char_const(&)[9],int_const&,char_const(&)[2],int_const&,char_const(&)[3],std::__cxx11::string&>
              (&local_40,(char (*) [9])"Error: @",(int *)this,(char (*) [2])0x1103f1f,
               &(this->location).column,(char (*) [3])0x11460c8,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetErrorMessage() const
    {
      std::string output = message;
      if (location.line > 0) {
        output = cmStrCat("Error: @", location.line, ",", location.column,
                          ": ", output);
      }
      return output;
    }